

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O3

void __thiscall
IlmThread_3_2::ThreadPool::setThreadProvider(ThreadPool *this,ThreadPoolProvider *provider)

{
  Data *this_00;
  ProviderPtr local_18;
  
  this_00 = this->_data;
  local_18.super___shared_ptr<IlmThread_3_2::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = provider;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<IlmThread_3_2::ThreadPoolProvider*>
            (&local_18.
              super___shared_ptr<IlmThread_3_2::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,provider);
  Data::setProvider(this_00,&local_18);
  if (local_18.super___shared_ptr<IlmThread_3_2::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_18.
               super___shared_ptr<IlmThread_3_2::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void
ThreadPool::setThreadProvider (ThreadPoolProvider* provider)
{
#ifdef ENABLE_THREADING
    // contract is we take ownership and will free the provider
    _data->setProvider (Data::ProviderPtr (provider));
#else
    throw IEX_INTERNAL_NAMESPACE::ArgExc (
        "Attempt to set a thread provider on a system with threads"
        " disabled / not available");
#endif
}